

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::ConvertToFloat(float *dst,void *src,DataType dt,int numChannels)

{
  ulong uVar1;
  ulong uVar2;
  
  switch(dt) {
  case dt_uint8:
    uVar1 = 0;
    uVar2 = (ulong)(uint)numChannels;
    if (numChannels < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dst[uVar1] = (float)*(byte *)((long)src + uVar1) * 0.003921569 + 0.0;
    }
    break;
  case dt_uint16:
    uVar1 = 0;
    uVar2 = (ulong)(uint)numChannels;
    if (numChannels < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dst[uVar1] = (float)*(ushort *)((long)src + uVar1 * 2) * 1.5259022e-05 + 0.0;
    }
    break;
  case dt_half:
    uVar1 = 0;
    uVar2 = (ulong)(uint)numChannels;
    if (numChannels < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dst[uVar1] = *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)src + uVar1 * 2) * 4) +
                   0.0;
    }
    break;
  case dt_float:
    memcpy(dst,src,(long)numChannels << 2);
    return;
  }
  return;
}

Assistant:

void ConvertToFloat(float* dst, const void* src, DataType dt, int numChannels)
{
    switch (dt) {
    case dt_uint8:  ConvertArray(dst, static_cast<const uint8_t*>(src),  numChannels, 1.f/255.f); break;
    case dt_uint16: ConvertArray(dst, static_cast<const uint16_t*>(src), numChannels, 1.f/65535.f); break;
    case dt_half:   ConvertArray(dst, static_cast<const PtexHalf*>(src), numChannels, 1.f); break;
    case dt_float:  memcpy(dst, src, sizeof(float)*numChannels); break;
    }
}